

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  uchar *puVar1;
  uchar uVar2;
  long lVar3;
  void *prealloc_00;
  secp256k1_context *psVar4;
  uchar *p1;
  uchar *data;
  char *pcVar5;
  char *__src;
  bool bVar6;
  uchar out [32];
  uchar local_a8 [32];
  secp256k1_sha256 local_88;
  
  data = local_a8;
  local_88.s[0] = 0x6a09e667;
  local_88.s[1] = 0xbb67ae85;
  local_88.s[2] = 0x3c6ef372;
  local_88.s[3] = 0xa54ff53a;
  local_88.s[4] = 0x510e527f;
  local_88.s[5] = 0x9b05688c;
  local_88.s[6] = 0x1f83d9ab;
  local_88.s[7] = 0x5be0cd19;
  local_88.bytes = 0;
  secp256k1_sha256_write
            (&local_88,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_88,local_a8);
  lVar3 = 0;
  do {
    puVar1 = local_a8 + lVar3;
    uVar2 = (&secp256k1_selftest_sha256_output32)[lVar3];
    data = (uchar *)CONCAT71((int7)((ulong)data >> 8),uVar2);
    if (*puVar1 != uVar2) break;
    bVar6 = lVar3 != 0x1f;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  if (*puVar1 == uVar2) {
    if ((char)flags == '\x01') {
      *(secp256k1_callback *)((long)prealloc + 0xa8) = default_illegal_callback;
      *(secp256k1_callback *)((long)prealloc + 0xb8) = default_error_callback;
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)prealloc,(uchar *)0x0);
      *(undefined4 *)prealloc = 1;
      *(uint *)((long)prealloc + 200) = flags >> 10 & 1;
      return (secp256k1_context *)prealloc;
    }
    secp256k1_context_preallocated_create_cold_1();
  }
  pcVar5 = "self test failed";
  secp256k1_default_error_callback_fn("self test failed",data);
  if ((char)pcVar5 == '\x01') {
    __src = (char *)0xd0;
    prealloc_00 = malloc(0xd0);
    if (prealloc_00 != (void *)0x0) {
      psVar4 = secp256k1_context_preallocated_create(prealloc_00,(uint)pcVar5);
      return psVar4;
    }
  }
  else {
    secp256k1_context_create_cold_1();
    __src = pcVar5;
  }
  secp256k1_context_create_cold_2();
  if (data != (undefined1 *)0x0) {
    psVar4 = (secp256k1_context *)memcpy(data,__src,0xd0);
    return psVar4;
  }
  secp256k1_context_preallocated_clone_cold_1();
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}